

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deflate.cpp
# Opt level: O2

void __thiscall DeflateDecoder::run(DeflateDecoder *this)

{
  ostream *poVar1;
  Lz77Decoder lz77;
  HuffmanDecoder huffman;
  string sStack_108;
  undefined1 local_e8 [80];
  string local_98 [32];
  undefined1 local_78 [104];
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Deflate decryption...");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string((string *)local_e8,(string *)&(this->super_Cryptor).in_message_);
  HuffmanDecoder::HuffmanDecoder((HuffmanDecoder *)local_78,(string *)local_e8);
  std::__cxx11::string::~string((string *)local_e8);
  HuffmanDecoder::run((HuffmanDecoder *)local_78);
  std::__cxx11::string::string((string *)&sStack_108,(string *)(local_78 + 0x28));
  Lz77Decoder::Lz77Decoder((Lz77Decoder *)local_e8,&sStack_108);
  std::__cxx11::string::~string((string *)&sStack_108);
  Lz77Decoder::run((Lz77Decoder *)local_e8);
  std::__cxx11::string::string(local_98,(string *)(local_e8 + 0x28));
  std::__cxx11::string::operator=((string *)&(this->super_Cryptor).out_message_,local_98);
  std::__cxx11::string::~string(local_98);
  poVar1 = std::operator<<((ostream *)&std::cout,"decryption done");
  std::endl<char,std::char_traits<char>>(poVar1);
  Cryptor::~Cryptor((Cryptor *)local_e8);
  HuffmanDecoder::~HuffmanDecoder((HuffmanDecoder *)local_78);
  return;
}

Assistant:

void DeflateDecoder::run() {
  cout << "Deflate decryption..." << endl;

  HuffmanDecoder huffman(get_in_message());
  huffman.run();
  Lz77Decoder lz77(huffman.get_out_message());
  lz77.run();
  set_out_message(lz77.get_out_message());

  cout << "decryption done" << endl;
}